

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall
sptk::reaper::EpochTracker::GetFilledEpochs
          (EpochTracker *this,float unvoiced_pm_interval,
          vector<float,_std::allocator<float>_> *times,
          vector<short,_std::allocator<short>_> *voicing)

{
  pointer pfVar1;
  pointer psVar2;
  pointer pTVar3;
  iterator iVar4;
  iterator iVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  int32_t *piVar9;
  uint uVar10;
  int iVar11;
  int32_t i_old;
  float fVar13;
  float fVar14;
  float time;
  float local_4c;
  short local_48 [2];
  float local_44;
  float local_40;
  float local_3c;
  ulong local_38;
  ulong uVar12;
  
  pfVar1 = (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pfVar1;
  }
  psVar2 = (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish != psVar2) {
    (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
    _M_finish = psVar2;
  }
  uVar10 = (int)((ulong)((long)(this->output_).
                               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->output_).
                              super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
  uVar12 = (ulong)uVar10;
  if (-1 < (int)uVar10) {
    fVar13 = (float)(ulong)((long)(this->norm_residual_).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(this->norm_residual_).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) / this->sample_rate_;
    local_40 = unvoiced_pm_interval;
    local_38 = uVar12;
    do {
      pTVar3 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4c = (float)pTVar3[uVar10].resid_index / this->sample_rate_;
      if ((pTVar3[uVar10].voiced != false) ||
         ((uVar8 = (ulong)uVar10, (int)uVar10 < (int)(uint)uVar12 &&
          (uVar8 = (ulong)uVar10, pTVar3[(ulong)uVar10 + 1].voiced == true)))) {
        iVar4._M_current =
             (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)times,iVar4,&local_4c);
        }
        else {
          *iVar4._M_current = local_4c;
          (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
          ._M_finish = iVar4._M_current + 1;
        }
        local_48[1] = 1;
        iVar5._M_current =
             (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (voicing,iVar5,local_48 + 1);
        }
        else {
          *iVar5._M_current = 1;
          (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        uVar8 = (ulong)(uVar10 - 1);
      }
      uVar7 = (uint)uVar8;
      if (uVar7 == (uint)uVar12) {
        local_4c = 0.0;
      }
      if (0 < (int)uVar7) {
        pTVar3 = (this->output_).
                 super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pTVar3[uVar8].voiced == false) && (local_4c < fVar13)) {
          piVar9 = &pTVar3[uVar8].resid_index;
          do {
            if (((TrackerResults *)(piVar9 + -2))->voiced != false) {
              uVar12 = uVar8;
              fVar14 = -1.0 / this->max_f0_search_ + (float)*piVar9 / this->sample_rate_;
              break;
            }
            uVar12 = uVar8 - 1;
            piVar9 = piVar9 + -4;
            bVar6 = 1 < (long)uVar8;
            uVar8 = uVar12;
            fVar14 = fVar13;
          } while (bVar6);
          local_3c = local_4c + local_40;
          if (local_3c < fVar14) {
            iVar11 = 2;
            local_44 = fVar14;
            do {
              iVar4._M_current =
                   (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)times,iVar4,&local_3c);
                fVar14 = local_44;
              }
              else {
                *iVar4._M_current = local_3c;
                (times->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_48[0] = 0;
              iVar5._M_current =
                   (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                          (voicing,iVar5,local_48);
                fVar14 = local_44;
              }
              else {
                *iVar5._M_current = 0;
                (voicing->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              local_3c = (float)iVar11 * local_40 + local_4c;
              iVar11 = iVar11 + 1;
            } while (local_3c < fVar14);
          }
          uVar7 = (uint)uVar12;
          uVar12 = local_38;
        }
      }
      uVar10 = uVar7 - (uVar7 == uVar10);
    } while (-1 < (int)uVar10);
  }
  return;
}

Assistant:

void EpochTracker::GetFilledEpochs(float unvoiced_pm_interval,
                                   std::vector<float>* times,
                                   std::vector<int16_t>* voicing) {
  times->clear();
  voicing->clear();
  float final_time = norm_residual_.size() / sample_rate_;
  int32_t limit = output_.size() - 1;
  int32_t i = limit;
  // Produce the output in normal time order.
  while (i >= 0) {
    int32_t i_old = i;
    float time = output_[i].resid_index / sample_rate_;
    // Note that the pulse locations of both the beginning and end
    // of any voiced period are of interest.
    if (output_[i].voiced || ((i < limit) && (output_[i+1].voiced))) {
      times->push_back(time);
      voicing->push_back(1);
      i--;
    }
    if (i == limit) {
      time = 0.0;
    }
    if ((i > 0) && (!output_[i].voiced) && (time < final_time)) {
      for ( ; i > 0; --i) {
        if (output_[i].voiced) {
          break;
        }
      }
      float next_time = final_time;
      int32_t fill_ind = 1;
      if (i > 0) {
        next_time = (output_[i].resid_index / sample_rate_) -
            (1.0 / max_f0_search_);
      }
      float now = time + (fill_ind * unvoiced_pm_interval);
      while (now < next_time) {
        times->push_back(now);
        voicing->push_back(0);
        fill_ind++;
        now = time + (fill_ind * unvoiced_pm_interval);
      }
    }
    if (i == i_old) {
      i--;
    }
  }
}